

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnStructType
          (BinaryReaderObjdump *this,Index index,Index field_count,TypeMut *fields)

{
  bool bVar1;
  uint local_2c;
  Index i;
  TypeMut *fields_local;
  Index field_count_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  
  bVar1 = ShouldPrintDetails(this);
  if (bVar1) {
    printf(" - type[%u] (struct");
    for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
      if ((fields[local_2c].mutable_ & 1U) != 0) {
        printf(" (mut");
      }
      Type::GetName(&fields[local_2c].type);
      printf(" %s");
      if ((fields[local_2c].mutable_ & 1U) != 0) {
        printf(")");
      }
    }
    printf(")\n");
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnStructType(Index index,
                                         Index field_count,
                                         TypeMut* fields) {
  if (!ShouldPrintDetails()) {
    return Result::Ok;
  }
  printf(" - type[%" PRIindex "] (struct", index);
  for (Index i = 0; i < field_count; i++) {
    if (fields[i].mutable_) {
      printf(" (mut");
    }
    printf(" %s", fields[i].type.GetName());
    if (fields[i].mutable_) {
      printf(")");
    }
  }
  printf(")\n");
  return Result::Ok;
}